

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authprogs_test_driver.c
# Opt level: O1

int main(int ac,char **av)

{
  int iVar1;
  int iVar2;
  clock_t cVar3;
  clock_t cVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  functionMapEntry *pfVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  int testNum;
  uint local_44;
  char *local_40;
  uint local_34;
  
  local_44 = 0;
  uVar6 = 0xffffffff;
  if (ac < 2) {
    puts("Available tests:");
    pfVar10 = cmakeGeneratedFunctionMapEntries;
    uVar8 = 0;
    do {
      printf("%3d. %s\n",uVar8 & 0xffffffff,pfVar10->name);
      uVar8 = uVar8 + 1;
      pfVar10 = pfVar10 + 1;
    } while (uVar8 != 3);
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar1 = __isoc99_scanf("%d",&local_44);
    if (iVar1 != 1) {
      pcVar7 = "Couldn\'t parse that input as a number";
      goto LAB_00102409;
    }
    if (2 < (int)local_44) {
      pcVar7 = "%3d is an invalid test number.\n";
      goto LAB_0010238f;
    }
    ac = ac + -1;
    av = av + 1;
    uVar6 = local_44;
  }
  if (ac < 2 || uVar6 != 0xffffffff) {
    uVar9 = 0;
    bVar13 = true;
  }
  else {
    pcVar7 = av[1];
    iVar1 = strcmp(pcVar7,"-R");
    uVar9 = (uint)(iVar1 == 0);
    iVar1 = strcmp(pcVar7,"-A");
    bVar13 = iVar1 != 0;
  }
  if ((ac < 3 & (byte)uVar9) != 1) {
    if (!bVar13) {
      puts("TAP version 13");
      printf("1..%d\n",3);
      lVar11 = 0;
      do {
        pcVar7 = cmakeGeneratedFunctionMapEntries[lVar11].name;
        if (2 < ac) {
          uVar8 = 0;
          do {
            iVar1 = strcmp(pcVar7,av[uVar8 + 2]);
            if (iVar1 == 0) {
              printf("ok %d %s # SKIP\n",(ulong)((int)lVar11 + 1),pcVar7);
              goto LAB_0010251c;
            }
            uVar8 = uVar8 + 1;
          } while (ac - 2 != uVar8);
        }
        cVar3 = clock();
        iVar1 = (*cmakeGeneratedFunctionMapEntries[lVar11].func)(ac,av);
        cVar4 = clock();
        pcVar5 = "ok";
        if (iVar1 == -1) {
          pcVar5 = "not ok";
        }
        printf("%s %d %s # %f\n",(double)(cVar4 - cVar3) / 1000000.0,pcVar5,(ulong)((int)lVar11 + 1)
               ,pcVar7);
LAB_0010251c:
        lVar11 = lVar11 + 1;
        if (lVar11 == 3) {
          puts("All tests finished.");
          return 0;
        }
      } while( true );
    }
    local_34 = uVar9;
    if (uVar6 == 0xffffffff) {
      local_40 = lowercase(av[(ulong)uVar9 + 1]);
    }
    else {
      local_40 = (char *)0x0;
    }
    bVar13 = uVar6 == 0xffffffff;
    if (bVar13) {
      pfVar10 = cmakeGeneratedFunctionMapEntries;
      uVar8 = 0;
      do {
        pcVar7 = lowercase(pfVar10->name);
        uVar9 = local_34;
        if ((local_34 == 0) || (pcVar5 = strstr(pcVar7,local_40), pcVar5 == (char *)0x0)) {
          uVar6 = 0xffffffff;
          if ((uVar9 == 0) && (iVar1 = strcmp(pcVar7,local_40), iVar1 == 0)) {
            ac = ac + -1;
            av = av + 1;
            goto LAB_0010262f;
          }
        }
        else {
          ac = ac + -2;
          av = av + 2;
LAB_0010262f:
          uVar6 = (uint)uVar8;
        }
        free(pcVar7);
        bVar13 = uVar6 == 0xffffffff;
        if (!bVar13) break;
        pfVar10 = pfVar10 + 1;
        bVar12 = uVar8 < 2;
        uVar8 = uVar8 + 1;
      } while (bVar12);
    }
    free(local_40);
    if (bVar13) {
      puts("Available tests:");
      pfVar10 = cmakeGeneratedFunctionMapEntries;
      uVar8 = 0;
      do {
        printf("%3d. %s\n",uVar8 & 0xffffffff,pfVar10->name);
        uVar8 = uVar8 + 1;
        pfVar10 = pfVar10 + 1;
      } while (uVar8 != 3);
      printf("Failed: %s is an invalid test name.\n",av[1]);
      return -1;
    }
    iVar1 = test_framework_init(ac,av);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (uVar6 < 3) {
      iVar1 = (*cmakeGeneratedFunctionMapEntries[uVar6].func)(ac,av);
      iVar2 = test_framework_uninit(ac,av,iVar1);
      if (iVar2 == 0) {
        return iVar1;
      }
      return iVar2;
    }
    pcVar7 = "testToRun was modified by TestDriver code to an invalid value: %3d.\n";
LAB_0010238f:
    printf(pcVar7,(ulong)local_44);
    return -1;
  }
  pcVar7 = "-R needs an additional parameter.";
LAB_00102409:
  puts(pcVar7);
  return -1;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;
int rc = test_framework_init(ac, av); if (rc != TEST_NO_ERROR) return rc;
    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);
rc = test_framework_uninit(ac, av, result); if (rc != TEST_NO_ERROR) return rc;
    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}